

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

field_type test::get_field_type(string *field)

{
  bool bVar1;
  field_type fVar2;
  
  bVar1 = std::operator==(field,"build_number");
  fVar2 = INT;
  if (!bVar1) {
    bVar1 = std::operator==(field,"n_batch");
    if (!bVar1) {
      bVar1 = std::operator==(field,"n_ubatch");
      if (!bVar1) {
        bVar1 = std::operator==(field,"n_threads");
        if (!bVar1) {
          bVar1 = std::operator==(field,"poll");
          if (!bVar1) {
            bVar1 = std::operator==(field,"model_size");
            if (!bVar1) {
              bVar1 = std::operator==(field,"model_n_params");
              if (!bVar1) {
                bVar1 = std::operator==(field,"n_gpu_layers");
                if (!bVar1) {
                  bVar1 = std::operator==(field,"main_gpu");
                  if (!bVar1) {
                    bVar1 = std::operator==(field,"n_prompt");
                    if (!bVar1) {
                      bVar1 = std::operator==(field,"n_gen");
                      if (!bVar1) {
                        bVar1 = std::operator==(field,"avg_ns");
                        if (!bVar1) {
                          bVar1 = std::operator==(field,"stddev_ns");
                          if (!bVar1) {
                            bVar1 = std::operator==(field,"f16_kv");
                            fVar2 = BOOL;
                            if (!bVar1) {
                              bVar1 = std::operator==(field,"no_kv_offload");
                              if (!bVar1) {
                                bVar1 = std::operator==(field,"cpu_strict");
                                if (!bVar1) {
                                  bVar1 = std::operator==(field,"flash_attn");
                                  if (!bVar1) {
                                    bVar1 = std::operator==(field,"use_mmap");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(field,"embeddings");
                                      if (!bVar1) {
                                        bVar1 = std::operator==(field,"avg_ts");
                                        if (bVar1) {
                                          fVar2 = FLOAT;
                                        }
                                        else {
                                          bVar1 = std::operator==(field,"stddev_ts");
                                          fVar2 = (uint)bVar1 + (uint)bVar1 * 2;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return fVar2;
}

Assistant:

static field_type get_field_type(const std::string & field) {
        if (field == "build_number" || field == "n_batch" || field == "n_ubatch" || field == "n_threads" ||
            field == "poll" || field == "model_size" || field == "model_n_params" || field == "n_gpu_layers" ||
            field == "main_gpu" || field == "n_prompt" || field == "n_gen" || field == "avg_ns" ||
            field == "stddev_ns") {
            return INT;
        }
        if (field == "f16_kv" || field == "no_kv_offload" || field == "cpu_strict" || field == "flash_attn" ||
            field == "use_mmap" || field == "embeddings") {
            return BOOL;
        }
        if (field == "avg_ts" || field == "stddev_ts") {
            return FLOAT;
        }
        return STRING;
    }